

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# udp.c
# Opt level: O2

int uv_udp_set_multicast_interface(uv_udp_t *handle,char *interface_addr)

{
  int iVar1;
  int *piVar2;
  int iVar3;
  sockaddr_storage addr_st;
  
  if (interface_addr == (char *)0x0) {
    addr_st.__ss_padding[0x6e] = '\0';
    addr_st.__ss_padding[0x6f] = '\0';
    addr_st.__ss_padding[0x70] = '\0';
    addr_st.__ss_padding[0x71] = '\0';
    addr_st.__ss_padding[0x72] = '\0';
    addr_st.__ss_padding[0x73] = '\0';
    addr_st.__ss_padding[0x74] = '\0';
    addr_st.__ss_padding[0x75] = '\0';
    addr_st.__ss_align = 0;
    addr_st.__ss_padding[0x5e] = '\0';
    addr_st.__ss_padding[0x5f] = '\0';
    addr_st.__ss_padding[0x60] = '\0';
    addr_st.__ss_padding[0x61] = '\0';
    addr_st.__ss_padding[0x62] = '\0';
    addr_st.__ss_padding[99] = '\0';
    addr_st.__ss_padding[100] = '\0';
    addr_st.__ss_padding[0x65] = '\0';
    addr_st.__ss_padding[0x66] = '\0';
    addr_st.__ss_padding[0x67] = '\0';
    addr_st.__ss_padding[0x68] = '\0';
    addr_st.__ss_padding[0x69] = '\0';
    addr_st.__ss_padding[0x6a] = '\0';
    addr_st.__ss_padding[0x6b] = '\0';
    addr_st.__ss_padding[0x6c] = '\0';
    addr_st.__ss_padding[0x6d] = '\0';
    addr_st.__ss_padding[0x4e] = '\0';
    addr_st.__ss_padding[0x4f] = '\0';
    addr_st.__ss_padding[0x50] = '\0';
    addr_st.__ss_padding[0x51] = '\0';
    addr_st.__ss_padding[0x52] = '\0';
    addr_st.__ss_padding[0x53] = '\0';
    addr_st.__ss_padding[0x54] = '\0';
    addr_st.__ss_padding[0x55] = '\0';
    addr_st.__ss_padding[0x56] = '\0';
    addr_st.__ss_padding[0x57] = '\0';
    addr_st.__ss_padding[0x58] = '\0';
    addr_st.__ss_padding[0x59] = '\0';
    addr_st.__ss_padding[0x5a] = '\0';
    addr_st.__ss_padding[0x5b] = '\0';
    addr_st.__ss_padding[0x5c] = '\0';
    addr_st.__ss_padding[0x5d] = '\0';
    addr_st.__ss_padding[0x3e] = '\0';
    addr_st.__ss_padding[0x3f] = '\0';
    addr_st.__ss_padding[0x40] = '\0';
    addr_st.__ss_padding[0x41] = '\0';
    addr_st.__ss_padding[0x42] = '\0';
    addr_st.__ss_padding[0x43] = '\0';
    addr_st.__ss_padding[0x44] = '\0';
    addr_st.__ss_padding[0x45] = '\0';
    addr_st.__ss_padding[0x46] = '\0';
    addr_st.__ss_padding[0x47] = '\0';
    addr_st.__ss_padding[0x48] = '\0';
    addr_st.__ss_padding[0x49] = '\0';
    addr_st.__ss_padding[0x4a] = '\0';
    addr_st.__ss_padding[0x4b] = '\0';
    addr_st.__ss_padding[0x4c] = '\0';
    addr_st.__ss_padding[0x4d] = '\0';
    addr_st.__ss_padding[0x2e] = '\0';
    addr_st.__ss_padding[0x2f] = '\0';
    addr_st.__ss_padding[0x30] = '\0';
    addr_st.__ss_padding[0x31] = '\0';
    addr_st.__ss_padding[0x32] = '\0';
    addr_st.__ss_padding[0x33] = '\0';
    addr_st.__ss_padding[0x34] = '\0';
    addr_st.__ss_padding[0x35] = '\0';
    addr_st.__ss_padding[0x36] = '\0';
    addr_st.__ss_padding[0x37] = '\0';
    addr_st.__ss_padding[0x38] = '\0';
    addr_st.__ss_padding[0x39] = '\0';
    addr_st.__ss_padding[0x3a] = '\0';
    addr_st.__ss_padding[0x3b] = '\0';
    addr_st.__ss_padding[0x3c] = '\0';
    addr_st.__ss_padding[0x3d] = '\0';
    addr_st.__ss_padding[0x1e] = '\0';
    addr_st.__ss_padding[0x1f] = '\0';
    addr_st.__ss_padding[0x20] = '\0';
    addr_st.__ss_padding[0x21] = '\0';
    addr_st.__ss_padding[0x22] = '\0';
    addr_st.__ss_padding[0x23] = '\0';
    addr_st.__ss_padding[0x24] = '\0';
    addr_st.__ss_padding[0x25] = '\0';
    addr_st.__ss_padding[0x26] = '\0';
    addr_st.__ss_padding[0x27] = '\0';
    addr_st.__ss_padding[0x28] = '\0';
    addr_st.__ss_padding[0x29] = '\0';
    addr_st.__ss_padding[0x2a] = '\0';
    addr_st.__ss_padding[0x2b] = '\0';
    addr_st.__ss_padding[0x2c] = '\0';
    addr_st.__ss_padding[0x2d] = '\0';
    addr_st.__ss_padding[0xe] = '\0';
    addr_st.__ss_padding[0xf] = '\0';
    addr_st.__ss_padding[0x10] = '\0';
    addr_st.__ss_padding[0x11] = '\0';
    addr_st.__ss_padding[0x12] = '\0';
    addr_st.__ss_padding[0x13] = '\0';
    addr_st.__ss_padding[0x14] = '\0';
    addr_st.__ss_padding[0x15] = '\0';
    addr_st.__ss_padding[0x16] = '\0';
    addr_st.__ss_padding[0x17] = '\0';
    addr_st.__ss_padding[0x18] = '\0';
    addr_st.__ss_padding[0x19] = '\0';
    addr_st.__ss_padding[0x1a] = '\0';
    addr_st.__ss_padding[0x1b] = '\0';
    addr_st.__ss_padding[0x1c] = '\0';
    addr_st.__ss_padding[0x1d] = '\0';
    addr_st.__ss_padding[6] = '\0';
    addr_st.__ss_padding[7] = '\0';
    addr_st.__ss_padding[8] = '\0';
    addr_st.__ss_padding[9] = '\0';
    addr_st.__ss_padding[10] = '\0';
    addr_st.__ss_padding[0xb] = '\0';
    addr_st.__ss_padding[0xc] = '\0';
    addr_st.__ss_padding[0xd] = '\0';
    if ((handle->flags & 0x400000) == 0) {
      addr_st.ss_family = 2;
      addr_st.__ss_padding[0] = '\0';
      addr_st.__ss_padding[1] = '\0';
      addr_st.__ss_padding[2] = '\0';
      addr_st.__ss_padding[3] = '\0';
      addr_st.__ss_padding[4] = '\0';
      addr_st.__ss_padding[5] = '\0';
      goto LAB_00595f57;
    }
    addr_st.ss_family = 10;
    addr_st.__ss_padding[0] = '\0';
    addr_st.__ss_padding[1] = '\0';
    addr_st.__ss_padding[2] = '\0';
    addr_st.__ss_padding[3] = '\0';
    addr_st.__ss_padding[4] = '\0';
    addr_st.__ss_padding[5] = '\0';
  }
  else {
    iVar1 = uv_ip4_addr(interface_addr,0,(sockaddr_in *)&addr_st);
    if ((iVar1 != 0) && (iVar1 = uv_ip6_addr(interface_addr,0,(sockaddr_in6 *)&addr_st), iVar1 != 0)
       ) {
      return -0x16;
    }
    if (addr_st.ss_family != 10) {
      if (addr_st.ss_family != 2) {
        __assert_fail("0 && \"unexpected address family\"",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Utilities/cmlibuv/src/unix/udp.c"
                      ,0x549,"int uv_udp_set_multicast_interface(uv_udp_t *, const char *)");
      }
LAB_00595f57:
      iVar1 = setsockopt((handle->io_watcher).fd,0,0x20,addr_st.__ss_padding + 2,4);
      goto LAB_00595f96;
    }
  }
  iVar1 = setsockopt((handle->io_watcher).fd,0x29,0x11,addr_st.__ss_padding + 0x16,4);
LAB_00595f96:
  iVar3 = 0;
  if (iVar1 == -1) {
    piVar2 = __errno_location();
    iVar3 = -*piVar2;
  }
  return iVar3;
}

Assistant:

int uv_udp_set_multicast_interface(uv_udp_t* handle, const char* interface_addr) {
  struct sockaddr_storage addr_st;
  struct sockaddr_in* addr4;
  struct sockaddr_in6* addr6;

  addr4 = (struct sockaddr_in*) &addr_st;
  addr6 = (struct sockaddr_in6*) &addr_st;

  if (!interface_addr) {
    memset(&addr_st, 0, sizeof addr_st);
    if (handle->flags & UV_HANDLE_IPV6) {
      addr_st.ss_family = AF_INET6;
      addr6->sin6_scope_id = 0;
    } else {
      addr_st.ss_family = AF_INET;
      addr4->sin_addr.s_addr = htonl(INADDR_ANY);
    }
  } else if (uv_ip4_addr(interface_addr, 0, addr4) == 0) {
    /* nothing, address was parsed */
  } else if (uv_ip6_addr(interface_addr, 0, addr6) == 0) {
    /* nothing, address was parsed */
  } else {
    return UV_EINVAL;
  }

  if (addr_st.ss_family == AF_INET) {
    if (setsockopt(handle->io_watcher.fd,
                   IPPROTO_IP,
                   IP_MULTICAST_IF,
                   (void*) &addr4->sin_addr,
                   sizeof(addr4->sin_addr)) == -1) {
      return UV__ERR(errno);
    }
  } else if (addr_st.ss_family == AF_INET6) {
    if (setsockopt(handle->io_watcher.fd,
                   IPPROTO_IPV6,
                   IPV6_MULTICAST_IF,
                   &addr6->sin6_scope_id,
                   sizeof(addr6->sin6_scope_id)) == -1) {
      return UV__ERR(errno);
    }
  } else {
    assert(0 && "unexpected address family");
    abort();
  }

  return 0;
}